

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O3

void __thiscall
duckdb::UnaryAggregateHeap<int,_duckdb::GreaterThan>::Insert
          (UnaryAggregateHeap<int,_duckdb::GreaterThan> *this,ArenaAllocator *allocator,int *value)

{
  HeapEntry<int> *pHVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  
  pHVar1 = this->heap;
  uVar2 = this->size;
  if (uVar2 < this->capacity) {
    this->size = uVar2 + 1;
    iVar4 = *value;
    pHVar1[uVar2].value = iVar4;
    uVar7 = uVar2;
    if (1 < (long)(uVar2 + 1)) {
      do {
        uVar3 = uVar2 - 1;
        uVar5 = uVar3 >> 1;
        uVar7 = uVar2;
        if (pHVar1[uVar5].value <= iVar4) break;
        pHVar1[uVar2].value = pHVar1[uVar5].value;
        uVar2 = uVar5;
        uVar7 = 0;
      } while (1 < uVar3);
    }
  }
  else {
    iVar4 = *value;
    if (iVar4 <= pHVar1->value) {
      return;
    }
    if ((long)uVar2 < 2) {
      pHVar1[uVar2 - 1].value = iVar4;
      uVar7 = uVar2 - 1;
    }
    else {
      uVar7 = uVar2 * 4 - 4;
      iVar4 = pHVar1[uVar2 - 1].value;
      pHVar1[uVar2 - 1].value = pHVar1->value;
      lVar6 = (long)uVar7 >> 2;
      if (lVar6 < 3) {
        uVar3 = 0;
      }
      else {
        uVar5 = 0;
        do {
          if (pHVar1[uVar5 * 2 + 1].value < pHVar1[uVar5 * 2 + 2].value) {
            uVar3 = uVar5 * 2 + 1;
          }
          else {
            uVar3 = uVar5 * 2 + 2;
          }
          pHVar1[uVar5].value = pHVar1[uVar3].value;
          uVar5 = uVar3;
        } while ((long)uVar3 < (lVar6 - (lVar6 + -1 >> 0x3f)) + -1 >> 1);
      }
      if (((uVar7 & 4) == 0) && (uVar3 == lVar6 + -2 >> 1)) {
        pHVar1[uVar3].value = pHVar1[uVar3 * 2 + 1].value;
        uVar3 = uVar3 * 2 + 1;
      }
      if (0 < (long)uVar3) {
        do {
          uVar7 = uVar3 - 1;
          uVar5 = uVar7 >> 1;
          if (pHVar1[uVar5].value <= iVar4) goto LAB_012ad95c;
          pHVar1[uVar3].value = pHVar1[uVar5].value;
          uVar3 = uVar5;
        } while (1 < uVar7);
        uVar3 = 0;
      }
LAB_012ad95c:
      pHVar1[uVar3].value = iVar4;
      iVar4 = *value;
      pHVar1[uVar2 - 1].value = iVar4;
      uVar7 = uVar2 - 1;
      if (1 < (long)uVar2) {
        do {
          uVar2 = uVar7 - 1;
          uVar3 = uVar2 >> 1;
          if (pHVar1[uVar3].value <= iVar4) goto LAB_012ad906;
          pHVar1[uVar7].value = pHVar1[uVar3].value;
          uVar7 = uVar3;
        } while (1 < uVar2);
        uVar7 = 0;
      }
    }
  }
LAB_012ad906:
  pHVar1[uVar7].value = iVar4;
  return;
}

Assistant:

void Insert(ArenaAllocator &allocator, const T &value) {
		D_ASSERT(capacity != 0); // must be initialized

		// If the heap is not full, insert the value into a new slot
		if (size < capacity) {
			heap[size++].Assign(allocator, value);
			std::push_heap(heap, heap + size, Compare);
		}
		// If the heap is full, check if the value is greater than the smallest value in the heap
		// If it is, assign the new value to the slot and re-heapify
		else if (T_COMPARATOR::Operation(value, heap[0].value)) {
			std::pop_heap(heap, heap + size, Compare);
			heap[size - 1].Assign(allocator, value);
			std::push_heap(heap, heap + size, Compare);
		}
		D_ASSERT(std::is_heap(heap, heap + size, Compare));
	}